

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jurassic-jigsaw.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  int *piVar3;
  basic_ifstream<char,_std::char_traits<char>_> *file_00;
  __tuple_element_t<0UL,_tuple<unordered_multimap<array<char,_10UL>,_tile_orientation_t,_line_hash,_equal_to<array<char,_10UL>_>,_allocator<pair<const_array<char,_10UL>,_tile_orientation_t>_>_>,_unordered_multimap<pair<array<char,_10UL>,_array<char,_10UL>_>,_tile_orientation_t,_corner_hash,_equal_to<pair<array<char,_10UL>,_array<char,_10UL>_>_>,_allocator<pair<const_pair<array<char,_10UL>,_array<char,_10UL>_>,_tile_orientation_t>_>_>_>_>
  *edges_00;
  __tuple_element_t<1UL,_tuple<unordered_multimap<array<char,_10UL>,_tile_orientation_t,_line_hash,_equal_to<array<char,_10UL>_>,_allocator<pair<const_array<char,_10UL>,_tile_orientation_t>_>_>,_unordered_multimap<pair<array<char,_10UL>,_array<char,_10UL>_>,_tile_orientation_t,_corner_hash,_equal_to<pair<array<char,_10UL>,_array<char,_10UL>_>_>,_allocator<pair<const_pair<array<char,_10UL>,_array<char,_10UL>_>,_tile_orientation_t>_>_>_>_>
  *corners_00;
  size_type __x;
  ulong width;
  reference this;
  uint64_t uVar4;
  unsigned_long *puVar5;
  __type_conflict _Var6;
  optional<unsigned_long> oVar7;
  _Storage<unsigned_long,_true> local_440;
  optional<unsigned_long> rough;
  state_t *r;
  iterator __end1;
  iterator __begin1;
  vector<state_t,_std::allocator<state_t>_> *__range1;
  size_t a2;
  uint64_t a1;
  undefined1 local_398 [8];
  vector<state_t,_std::allocator<state_t>_> res;
  state_t state;
  size_t x;
  type *corners;
  type *edges;
  undefined1 local_290 [8];
  tiles_t tiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  basic_ifstream<char,_std::char_traits<char>_> *input;
  undefined1 local_228 [8];
  variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> file;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  file.super__Variant_base<int,_std::basic_ifstream<char,_std::char_traits<char>_>_>.
  super__Move_assign_alias<int,_std::basic_ifstream<char>_>.
  super__Copy_assign_alias<int,_std::basic_ifstream<char>_>.
  super__Move_ctor_alias<int,_std::basic_ifstream<char>_>.
  super__Copy_ctor_alias<int,_std::basic_ifstream<char>_>.
  super__Variant_storage_alias<int,_std::basic_ifstream<char>_>._520_8_ = argv;
  if (argc == 2) {
    get_input((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)local_228,2,argv)
    ;
    bVar1 = std::holds_alternative<int,int,std::ifstream>
                      ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                       local_228);
    if (bVar1) {
      piVar3 = std::get<int,int,std::ifstream>
                         ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                          local_228);
      argv_local._4_4_ = *piVar3;
    }
    else {
      file_00 = std::get<std::ifstream,int,std::ifstream>
                          ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                           local_228);
      tokenize_abi_cxx11_<std::ifstream>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&tiles._M_h._M_single_bucket,file_00);
      read_tiles((tiles_t *)local_290,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&tiles._M_h._M_single_bucket);
      make_catalogs((tuple<std::unordered_multimap<std::array<char,_10UL>,_tile_orientation_t,_generic_tile_t<10UL>::line_hash,_std::equal_to<std::array<char,_10UL>_>,_std::allocator<std::pair<const_std::array<char,_10UL>,_tile_orientation_t>_>_>,_std::unordered_multimap<std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>,_tile_orientation_t,_generic_tile_t<10UL>::corner_hash,_std::equal_to<std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>_>,_std::allocator<std::pair<const_std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>,_tile_orientation_t>_>_>_>
                     *)&edges,(tiles_t *)local_290);
      edges_00 = std::
                 get<0ul,std::unordered_multimap<std::array<char,10ul>,tile_orientation_t,generic_tile_t<10ul>::line_hash,std::equal_to<std::array<char,10ul>>,std::allocator<std::pair<std::array<char,10ul>const,tile_orientation_t>>>,std::unordered_multimap<std::pair<std::array<char,10ul>,std::array<char,10ul>>,tile_orientation_t,generic_tile_t<10ul>::corner_hash,std::equal_to<std::pair<std::array<char,10ul>,std::array<char,10ul>>>,std::allocator<std::pair<std::pair<std::array<char,10ul>,std::array<char,10ul>>const,tile_orientation_t>>>>
                           ((tuple<std::unordered_multimap<std::array<char,_10UL>,_tile_orientation_t,_generic_tile_t<10UL>::line_hash,_std::equal_to<std::array<char,_10UL>_>,_std::allocator<std::pair<const_std::array<char,_10UL>,_tile_orientation_t>_>_>,_std::unordered_multimap<std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>,_tile_orientation_t,_generic_tile_t<10UL>::corner_hash,_std::equal_to<std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>_>,_std::allocator<std::pair<const_std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>,_tile_orientation_t>_>_>_>
                             *)&edges);
      corners_00 = std::
                   get<1ul,std::unordered_multimap<std::array<char,10ul>,tile_orientation_t,generic_tile_t<10ul>::line_hash,std::equal_to<std::array<char,10ul>>,std::allocator<std::pair<std::array<char,10ul>const,tile_orientation_t>>>,std::unordered_multimap<std::pair<std::array<char,10ul>,std::array<char,10ul>>,tile_orientation_t,generic_tile_t<10ul>::corner_hash,std::equal_to<std::pair<std::array<char,10ul>,std::array<char,10ul>>>,std::allocator<std::pair<std::pair<std::array<char,10ul>,std::array<char,10ul>>const,tile_orientation_t>>>>
                             ((tuple<std::unordered_multimap<std::array<char,_10UL>,_tile_orientation_t,_generic_tile_t<10UL>::line_hash,_std::equal_to<std::array<char,_10UL>_>,_std::allocator<std::pair<const_std::array<char,_10UL>,_tile_orientation_t>_>_>,_std::unordered_multimap<std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>,_tile_orientation_t,_generic_tile_t<10UL>::corner_hash,_std::equal_to<std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>_>,_std::allocator<std::pair<const_std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>,_tile_orientation_t>_>_>_>
                               *)&edges);
      __x = std::
            unordered_map<unsigned_long,_generic_tile_t<10UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_generic_tile_t<10UL>_>_>_>
            ::size((unordered_map<unsigned_long,_generic_tile_t<10UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_generic_tile_t<10UL>_>_>_>
                    *)local_290);
      _Var6 = std::sqrt<unsigned_long>(__x);
      width = (long)_Var6 | (long)(_Var6 - 9.223372036854776e+18) & (long)_Var6 >> 0x3f;
      state_t::state_t((state_t *)
                       &res.super__Vector_base<state_t,_std::allocator<state_t>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,width,width,(tiles_t *)local_290);
      state_t::state_t((state_t *)&a1,
                       (state_t *)
                       &res.super__Vector_base<state_t,_std::allocator<state_t>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
      solve((vector<state_t,_std::allocator<state_t>_> *)local_398,(tiles_t *)local_290,edges_00,
            corners_00,(state_t *)&a1);
      state_t::~state_t((state_t *)&a1);
      this = std::vector<state_t,_std::allocator<state_t>_>::front
                       ((vector<state_t,_std::allocator<state_t>_> *)local_398);
      uVar4 = state_t::magic_number(this);
      poVar2 = std::operator<<((ostream *)&std::cout,"Part 1: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar4);
      std::operator<<(poVar2,"\n");
      __end1 = std::vector<state_t,_std::allocator<state_t>_>::begin
                         ((vector<state_t,_std::allocator<state_t>_> *)local_398);
      r = (state_t *)
          std::vector<state_t,_std::allocator<state_t>_>::end
                    ((vector<state_t,_std::allocator<state_t>_> *)local_398);
      while (bVar1 = __gnu_cxx::
                     operator==<state_t_*,_std::vector<state_t,_std::allocator<state_t>_>_>
                               (&__end1,(__normal_iterator<state_t_*,_std::vector<state_t,_std::allocator<state_t>_>_>
                                         *)&r), ((bVar1 ^ 0xffU) & 1) != 0) {
        rough.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._8_8_ =
             __gnu_cxx::
             __normal_iterator<state_t_*,_std::vector<state_t,_std::allocator<state_t>_>_>::
             operator*(&__end1);
        oVar7 = sea_roughness((tiles_t *)local_290,
                              (state_t *)
                              rough.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                              super__Optional_payload_base<unsigned_long>._8_8_);
        local_440._M_value =
             oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload;
        rough.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
             oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_engaged;
        bVar1 = std::optional::operator_cast_to_bool((optional *)&local_440);
        if (bVar1) {
          puVar5 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&local_440);
          __range1 = (vector<state_t,_std::allocator<state_t>_> *)*puVar5;
          poVar2 = std::operator<<((ostream *)&std::cout,"Part 2: ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ulong)__range1);
          std::operator<<(poVar2,"\n");
          break;
        }
        __gnu_cxx::__normal_iterator<state_t_*,_std::vector<state_t,_std::allocator<state_t>_>_>::
        operator++(&__end1);
      }
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar4);
      poVar2 = std::operator<<(poVar2,"\n");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ulong)__range1);
      std::operator<<(poVar2,"\n");
      std::vector<state_t,_std::allocator<state_t>_>::~vector
                ((vector<state_t,_std::allocator<state_t>_> *)local_398);
      state_t::~state_t((state_t *)
                        &res.super__Vector_base<state_t,_std::allocator<state_t>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
      std::
      tuple<std::unordered_multimap<std::array<char,_10UL>,_tile_orientation_t,_generic_tile_t<10UL>::line_hash,_std::equal_to<std::array<char,_10UL>_>,_std::allocator<std::pair<const_std::array<char,_10UL>,_tile_orientation_t>_>_>,_std::unordered_multimap<std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>,_tile_orientation_t,_generic_tile_t<10UL>::corner_hash,_std::equal_to<std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>_>,_std::allocator<std::pair<const_std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>,_tile_orientation_t>_>_>_>
      ::~tuple((tuple<std::unordered_multimap<std::array<char,_10UL>,_tile_orientation_t,_generic_tile_t<10UL>::line_hash,_std::equal_to<std::array<char,_10UL>_>,_std::allocator<std::pair<const_std::array<char,_10UL>,_tile_orientation_t>_>_>,_std::unordered_multimap<std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>,_tile_orientation_t,_generic_tile_t<10UL>::corner_hash,_std::equal_to<std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>_>,_std::allocator<std::pair<const_std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>,_tile_orientation_t>_>_>_>
                *)&edges);
      std::
      unordered_map<unsigned_long,_generic_tile_t<10UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_generic_tile_t<10UL>_>_>_>
      ::~unordered_map((unordered_map<unsigned_long,_generic_tile_t<10UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_generic_tile_t<10UL>_>_>_>
                        *)local_290);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&tiles._M_h._M_single_bucket);
    }
    std::variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_>::~variant
              ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)local_228);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Usage: ");
    poVar2 = std::operator<<(poVar2,*(char **)file.
                                              super__Variant_base<int,_std::basic_ifstream<char,_std::char_traits<char>_>_>
                                              .
                                              super__Move_assign_alias<int,_std::basic_ifstream<char>_>
                                              .
                                              super__Copy_assign_alias<int,_std::basic_ifstream<char>_>
                                              .
                                              super__Move_ctor_alias<int,_std::basic_ifstream<char>_>
                                              .
                                              super__Copy_ctor_alias<int,_std::basic_ifstream<char>_>
                                              .
                                              super__Variant_storage_alias<int,_std::basic_ifstream<char>_>
                                              ._520_8_);
    poVar2 = std::operator<<(poVar2," {path-to-file}");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

auto main(int argc, char* argv[]) -> int {
  if (argc != 2) {
    std::cout << "Usage: " << argv[0] << " {path-to-file}" << std::endl;
    return 1;
  }

  auto file = get_input(argc, argv);

  if (std::holds_alternative<int>(file))
    return std::get<int>(file);

  auto& input = std::get<std::ifstream>(file);

  auto tokens = tokenize(input);

  auto tiles = read_tiles(tokens);

  // make LUTs
  auto [edges, corners] = make_catalogs(tiles);

  // try a logical image size: square N x N
  size_t x = std::sqrt(tiles.size());
  auto state = state_t { x, x, tiles };
  auto res = solve(tiles, edges, corners, state);

  auto a1 = res.front().magic_number();
  std::cout << "Part 1: " << a1 << "\n";

  size_t a2;
  for (const auto& r : res) {
    auto rough = sea_roughness(tiles, r);
    if (rough) {
      a2 = *rough;
      std::cout << "Part 2: " <<  a2 << "\n";
      break;
    }
  }

  std::cout << a1 << "\n" << a2 << "\n";
}